

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

void __thiscall
Minisat::Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::percolateUp
          (Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_> *this,int i)

{
  int x_00;
  int iVar1;
  int *piVar2;
  bool local_29;
  int local_1c;
  int p;
  int x;
  int i_local;
  Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_> *this_local;
  
  piVar2 = vec<int,_int>::operator[](&this->heap,i);
  x_00 = *piVar2;
  local_1c = parent(i);
  p = i;
  while( true ) {
    local_29 = false;
    if (p != 0) {
      piVar2 = vec<int,_int>::operator[](&this->heap,local_1c);
      local_29 = Solver::VarOrderLt::operator()(&this->lt,x_00,*piVar2);
    }
    if (local_29 == false) break;
    piVar2 = vec<int,_int>::operator[](&this->heap,local_1c);
    iVar1 = *piVar2;
    piVar2 = vec<int,_int>::operator[](&this->heap,p);
    *piVar2 = iVar1;
    piVar2 = vec<int,_int>::operator[](&this->heap,local_1c);
    piVar2 = IntMap<int,_int,_Minisat::MkIndexDefault<int>_>::operator[](&this->indices,*piVar2);
    *piVar2 = p;
    p = local_1c;
    local_1c = parent(local_1c);
  }
  piVar2 = vec<int,_int>::operator[](&this->heap,p);
  *piVar2 = x_00;
  piVar2 = IntMap<int,_int,_Minisat::MkIndexDefault<int>_>::operator[](&this->indices,x_00);
  *piVar2 = p;
  return;
}

Assistant:

void percolateUp(int i)
    {
        K   x  = heap[i];
        int p  = parent(i);
        
        while (i != 0 && lt(x, heap[p])){
            heap[i]          = heap[p];
            indices[heap[p]] = i;
            i                = p;
            p                = parent(p);
        }
        heap   [i] = x;
        indices[x] = i;
    }